

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O1

void anon_unknown.dwarf_8556a::test_parts<float>
               (int pattern_number,int number_of_parts,bool load_depths,bool entire_buffer,
               string *tempDir)

{
  pointer pcVar1;
  int iVar2;
  pointer pHVar3;
  bool dontbothercheckingdepth;
  int iVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  ostream *poVar8;
  long *plVar9;
  undefined4 *puVar10;
  undefined1 auVar11 [8];
  DeepScanLineInputPart *this;
  Box2i *pBVar12;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar13;
  int iVar14;
  data<float> *pdVar15;
  size_type sVar16;
  string *psVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  MultiPartOutputFile f;
  CompositeDeepScanLine comp;
  string fn;
  data<float> main;
  MultiPartInputFile input;
  vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  sub_parts;
  undefined1 local_318 [8];
  pointer local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  string local_2f8;
  ulong local_2d0;
  allocator_type local_2c1;
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 local_29c;
  long *local_298 [2];
  long local_288 [2];
  data<float> local_278;
  ulong local_1d8;
  string local_1d0;
  long *local_1b0;
  undefined1 local_1a8 [8];
  pointer pdStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_2a0 = (undefined4)CONCAT71(in_register_00000009,entire_buffer);
  local_29c = (undefined4)CONCAT71(in_register_00000011,load_depths);
  local_298[0] = local_288;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_298);
  data<float>::data(&local_278);
  local_1a8 = (undefined1  [8])&local_198;
  if (pattern_number == 0) {
    local_198._M_allocated_capacity._0_2_ = 0x5a;
    pdStack_1a0 = (pointer)0x1;
    data<float>::operator<<(&local_278,(string *)local_1a8);
    local_2f8.field_2._M_allocated_capacity._0_6_ = 0x6b6361425a;
    local_2f8._M_string_length = 5;
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    data<float>::operator<<(&local_278,&local_2f8);
    local_308._M_allocated_capacity._0_2_ = 0x41;
    local_310 = (pointer)0x1;
    local_318 = (undefined1  [8])&local_308;
    data<float>::operator<<(&local_278,(string *)local_318);
    local_2c0._16_2_ = 0x52;
    local_2c0._8_8_ = 1;
    psVar17 = (string *)local_2c0;
    local_2c0._0_8_ = local_2c0 + 0x10;
    data<float>::operator<<(&local_278,psVar17);
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      psVar17 = (string *)(CONCAT62(local_2c0._18_6_,local_2c0._16_2_) + 1);
      operator_delete((void *)local_2c0._0_8_,(ulong)psVar17);
    }
    if (local_318 != (undefined1  [8])&local_308) {
      psVar17 = (string *)
                (CONCAT62(local_308._M_allocated_capacity._2_6_,
                          local_308._M_allocated_capacity._0_2_) + 1);
      operator_delete((void *)local_318,(ulong)psVar17);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      psVar17 = (string *)(local_2f8.field_2._M_allocated_capacity + 1);
      operator_delete(local_2f8._M_dataplus._M_p,(ulong)psVar17);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      psVar17 = (string *)(local_198._M_allocated_capacity + 1);
      operator_delete((void *)local_1a8,(ulong)psVar17);
    }
    data<float>::operator<<(&local_278,1.0);
    data<float>::operator<<(&local_278,2.0);
    data<float>::operator<<(&local_278,0.0);
    data<float>::operator<<(&local_278,1.0);
    data<float>::operator<<(&local_278,(end *)psVar17);
    data<float>::operator<<(&local_278,2.1);
    data<float>::operator<<(&local_278,2.3);
    data<float>::operator<<(&local_278,0.5);
    data<float>::operator<<(&local_278,0.4);
    data<float>::operator<<(&local_278,(end *)psVar17);
    data<float>::operator<<(&local_278,(result *)psVar17);
    data<float>::operator<<(&local_278,3.1);
    data<float>::operator<<(&local_278,4.3);
    data<float>::operator<<(&local_278,0.5);
    data<float>::operator<<(&local_278,1.4);
    data<float>::operator<<(&local_278,(end *)psVar17);
    data<float>::operator<<(&local_278,10.0);
    data<float>::operator<<(&local_278,20.0);
    data<float>::operator<<(&local_278,1.0);
    data<float>::operator<<(&local_278,1.0);
    data<float>::operator<<(&local_278,(end *)psVar17);
    data<float>::operator<<(&local_278,20.0);
    data<float>::operator<<(&local_278,30.0);
    data<float>::operator<<(&local_278,1.0);
    data<float>::operator<<(&local_278,2.0);
    data<float>::operator<<(&local_278,(end *)psVar17);
    data<float>::operator<<(&local_278,(result *)psVar17);
    data<float>::operator<<(&local_278,10.0);
    data<float>::operator<<(&local_278,20.0);
    data<float>::operator<<(&local_278,1.0);
    data<float>::operator<<(&local_278,1.0);
    data<float>::operator<<(&local_278,(end *)psVar17);
    data<float>::operator<<(&local_278,(result *)psVar17);
    data<float>::operator<<(&local_278,0.0);
    data<float>::operator<<(&local_278,0.0);
    data<float>::operator<<(&local_278,0.0);
    data<float>::operator<<(&local_278,0.0);
    data<float>::operator<<(&local_278,(end *)psVar17);
  }
  else {
    local_198._M_allocated_capacity._0_2_ = 0x5a;
    pdStack_1a0 = (pointer)0x1;
    data<float>::operator<<(&local_278,(string *)local_1a8);
    local_2f8.field_2._M_allocated_capacity._0_2_ = 0x52;
    local_2f8._M_string_length = 1;
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    data<float>::operator<<(&local_278,&local_2f8);
    local_308._M_allocated_capacity._0_2_ = 0x47;
    local_310 = (pointer)0x1;
    local_318 = (undefined1  [8])&local_308;
    data<float>::operator<<(&local_278,(string *)local_318);
    local_2c0._16_2_ = 0x42;
    local_2c0._8_8_ = 1;
    local_2c0._0_8_ = local_2c0 + 0x10;
    data<float>::operator<<(&local_278,(string *)local_2c0);
    local_1d0.field_2._M_allocated_capacity._0_2_ = 0x41;
    local_1d0._M_string_length = 1;
    psVar17 = &local_1d0;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    data<float>::operator<<(&local_278,psVar17);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      psVar17 = (string *)
                (CONCAT62(local_1d0.field_2._M_allocated_capacity._2_6_,
                          local_1d0.field_2._M_allocated_capacity._0_2_) + 1);
      operator_delete(local_1d0._M_dataplus._M_p,(ulong)psVar17);
    }
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      psVar17 = (string *)(CONCAT62(local_2c0._18_6_,local_2c0._16_2_) + 1);
      operator_delete((void *)local_2c0._0_8_,(ulong)psVar17);
    }
    if (local_318 != (undefined1  [8])&local_308) {
      psVar17 = (string *)
                (CONCAT62(local_308._M_allocated_capacity._2_6_,
                          local_308._M_allocated_capacity._0_2_) + 1);
      operator_delete((void *)local_318,(ulong)psVar17);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      psVar17 = (string *)(local_2f8.field_2._M_allocated_capacity + 1);
      operator_delete(local_2f8._M_dataplus._M_p,(ulong)psVar17);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      psVar17 = (string *)(local_198._M_allocated_capacity + 1);
      operator_delete((void *)local_1a8,(ulong)psVar17);
    }
    iVar14 = 4;
    do {
      data<float>::operator<<(&local_278,1.0);
      data<float>::operator<<(&local_278,0.4);
      data<float>::operator<<(&local_278,1.25);
      data<float>::operator<<(&local_278,-0.1);
      data<float>::operator<<(&local_278,0.7);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,2.2);
      data<float>::operator<<(&local_278,0.2);
      data<float>::operator<<(&local_278,-0.1);
      data<float>::operator<<(&local_278,0.0);
      data<float>::operator<<(&local_278,0.24);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,2.3);
      data<float>::operator<<(&local_278,0.9);
      data<float>::operator<<(&local_278,0.56);
      data<float>::operator<<(&local_278,2.26);
      data<float>::operator<<(&local_278,0.9);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,5.0);
      data<float>::operator<<(&local_278,1.0);
      data<float>::operator<<(&local_278,0.5);
      data<float>::operator<<(&local_278,0.6);
      data<float>::operator<<(&local_278,0.2);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,(result *)psVar17);
      data<float>::operator<<(&local_278,2.2984);
      data<float>::operator<<(&local_278,0.688);
      data<float>::operator<<(&local_278,1.35908);
      data<float>::operator<<(&local_278,0.42896);
      data<float>::operator<<(&local_278,0.9817);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,1.0);
      data<float>::operator<<(&local_278,0.4);
      data<float>::operator<<(&local_278,1.25);
      data<float>::operator<<(&local_278,-0.1);
      data<float>::operator<<(&local_278,0.7);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,2.2);
      data<float>::operator<<(&local_278,0.2);
      data<float>::operator<<(&local_278,-0.1);
      data<float>::operator<<(&local_278,0.0);
      data<float>::operator<<(&local_278,0.24);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,2.3);
      data<float>::operator<<(&local_278,0.9);
      data<float>::operator<<(&local_278,0.56);
      data<float>::operator<<(&local_278,2.26);
      data<float>::operator<<(&local_278,0.9);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,5.0);
      data<float>::operator<<(&local_278,1.0);
      data<float>::operator<<(&local_278,0.5);
      data<float>::operator<<(&local_278,0.6);
      data<float>::operator<<(&local_278,0.2);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,11.0);
      data<float>::operator<<(&local_278,0.4);
      data<float>::operator<<(&local_278,1.25);
      data<float>::operator<<(&local_278,-0.1);
      data<float>::operator<<(&local_278,0.7);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,12.2);
      data<float>::operator<<(&local_278,0.2);
      data<float>::operator<<(&local_278,-0.1);
      data<float>::operator<<(&local_278,0.0);
      data<float>::operator<<(&local_278,0.24);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,12.3);
      data<float>::operator<<(&local_278,0.9);
      data<float>::operator<<(&local_278,0.56);
      data<float>::operator<<(&local_278,2.26);
      data<float>::operator<<(&local_278,0.9);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,15.0);
      data<float>::operator<<(&local_278,1.0);
      data<float>::operator<<(&local_278,0.5);
      data<float>::operator<<(&local_278,0.6);
      data<float>::operator<<(&local_278,0.2);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,(result *)psVar17);
      data<float>::operator<<(&local_278,2.62319);
      data<float>::operator<<(&local_278,0.7005);
      data<float>::operator<<(&local_278,1.38387);
      data<float>::operator<<(&local_278,0.43678);
      data<float>::operator<<(&local_278,0.99967);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,27.0);
      data<float>::operator<<(&local_278,1.0);
      data<float>::operator<<(&local_278,-1.0);
      data<float>::operator<<(&local_278,42.0);
      data<float>::operator<<(&local_278,14.0);
      data<float>::operator<<(&local_278,(end *)psVar17);
      data<float>::operator<<(&local_278,(result *)psVar17);
      data<float>::operator<<(&local_278,27.0);
      data<float>::operator<<(&local_278,1.0);
      data<float>::operator<<(&local_278,-1.0);
      data<float>::operator<<(&local_278,42.0);
      data<float>::operator<<(&local_278,14.0);
      data<float>::operator<<(&local_278,(end *)psVar17);
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  local_1b0 = local_298[0];
  local_2d0 = (ulong)(uint)number_of_parts;
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)local_318,local_2d0,
             (allocator_type *)local_1a8);
  lVar6 = Imf_3_2::Header::displayWindow();
  *(undefined4 *)(lVar6 + 8) = 0xa4;
  lVar6 = Imf_3_2::Header::displayWindow();
  *(undefined4 *)(lVar6 + 0xc) = 0xd8;
  iVar14 = random_int(400);
  piVar7 = (int *)Imf_3_2::Header::dataWindow();
  *piVar7 = iVar14 + -200;
  piVar7 = (int *)Imf_3_2::Header::dataWindow();
  iVar14 = *piVar7;
  iVar4 = random_int(400);
  lVar6 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar6 + 8) = iVar14 + iVar4 + 0x28;
  iVar14 = random_int(400);
  lVar6 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar6 + 4) = iVar14 + -200;
  lVar6 = Imf_3_2::Header::dataWindow();
  iVar14 = *(int *)(lVar6 + 4);
  iVar4 = random_int(400);
  lVar6 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar6 + 0xc) = iVar14 + iVar4 + 0x28;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"data window: ",0xd);
  piVar7 = (int *)Imf_3_2::Header::dataWindow();
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*piVar7);
  local_1a8[0] = (allocator_type)0x2c;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1a8,1);
  lVar6 = Imf_3_2::Header::dataWindow();
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*(int *)(lVar6 + 4));
  local_1a8[0] = (allocator_type)0x20;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1a8,1);
  lVar6 = Imf_3_2::Header::dataWindow();
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*(int *)(lVar6 + 8));
  local_1a8[0] = (allocator_type)0x2c;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_1a8,1);
  lVar6 = Imf_3_2::Header::dataWindow();
  plVar9 = (long *)std::ostream::operator<<(poVar8,*(int *)(lVar6 + 0xc));
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  Imf_3_2::Header::setType((string *)local_318);
  puVar10 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar10 = 2;
  local_198._M_allocated_capacity._0_6_ = 0x3074726150;
  pdStack_1a0 = (pointer)0x5;
  local_1a8 = (undefined1  [8])&local_198;
  Imf_3_2::Header::setName((string *)local_318);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
  }
  if (1 < number_of_parts) {
    uVar18 = 1;
    lVar6 = 0x38;
    do {
      Imf_3_2::Header::operator=((Header *)((long)local_318 + lVar6),(Header *)local_318);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Part",4);
      std::ostream::operator<<((ostringstream *)local_1a8,(int)uVar18);
      auVar11 = local_318;
      std::__cxx11::stringbuf::str();
      Imf_3_2::Header::setName((string *)((long)auVar11 + lVar6));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar18 = uVar18 + 1;
      lVar6 = lVar6 + 0x38;
    } while (local_2d0 != uVar18);
  }
  uVar18 = local_2d0;
  local_1a8 = (undefined1  [8])0x0;
  pdStack_1a0 = (pointer)0x0;
  local_198._M_allocated_capacity = 0;
  auVar11 = (undefined1  [8])operator_new(local_2d0 * 0xa0);
  local_198._M_allocated_capacity = (long)auVar11 + uVar18 * 0xa0;
  pdVar15 = (data<float> *)auVar11;
  uVar18 = local_2d0;
  local_1a8 = auVar11;
  pdStack_1a0 = (pointer)auVar11;
  if (number_of_parts != 0) {
    do {
      data<float>::data(pdVar15);
      pdVar15 = pdVar15 + 1;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  pdStack_1a0 = pdVar15;
  if (1 < number_of_parts) {
    if ((undefined1  [8])pdVar15 != auVar11) {
      lVar6 = 0x80;
      uVar18 = 0;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)auVar11 + lVar6 + -0x80),&local_278._channels);
        auVar11 = local_1a8;
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator=((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)((long)local_1a8 + lVar6 + -0x50),&local_278._results);
        *(PixelType *)((long)auVar11 + lVar6 + 0x18) = local_278._type;
        std::
        vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
        ::resize((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                  *)((long)auVar11 + lVar6),
                 ((long)local_278._samples.
                        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_278._samples.
                        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
        uVar18 = uVar18 + 1;
        lVar6 = lVar6 + 0xa0;
      } while (uVar18 < (ulong)(((long)pdStack_1a0 - (long)auVar11 >> 5) * -0x3333333333333333));
    }
    auVar11 = local_1a8;
    if (local_278._samples.
        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_278._samples.
        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar18 = (long)pdStack_1a0 - (long)local_1a8;
      uVar13 = 0;
      do {
        local_1d8 = uVar13;
        if (local_278._samples.
            super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar13].
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_278._samples.
            super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar13].
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar6 = 0;
          uVar19 = 0;
          do {
            iVar14 = random_int((int)(uVar18 >> 5) * -0x33333333);
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::push_back((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *)(*(long *)((long)auVar11 + (long)iVar14 * 0xa0 + 0x80) + uVar13 * 0x18),
                        (value_type *)
                        ((long)&((local_278._samples.
                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data + lVar6));
            uVar19 = uVar19 + 1;
            lVar6 = lVar6 + 0x18;
          } while (uVar19 < (ulong)(((long)local_278._samples.
                                           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_278._samples.
                                           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555));
        }
        uVar13 = local_1d8 + 1;
      } while (uVar13 < (ulong)(((long)local_278._samples.
                                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_278._samples.
                                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
  }
  if (number_of_parts == 1) {
    data<float>::setHeader(&local_278,(Header *)local_318);
  }
  else if (0 < number_of_parts) {
    lVar6 = local_2d0 * 0x38;
    lVar20 = 0;
    auVar11 = local_1a8;
    do {
      data<float>::setHeader((data<float> *)auVar11,(Header *)((long)local_318 + lVar20));
      lVar20 = lVar20 + 0x38;
      auVar11 = (undefined1  [8])((long)auVar11 + 0xa0);
    } while (lVar6 - lVar20 != 0);
  }
  pHVar3 = local_310;
  auVar11 = local_318;
  iVar14 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)&local_2f8,(char *)local_1b0,(Header *)auVar11,
             (int)((ulong)((long)pHVar3 - (long)auVar11) >> 3) * -0x49249249,false,iVar14);
  if (0 < number_of_parts) {
    uVar18 = 0;
    auVar11 = local_1a8;
    do {
      Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                ((DeepScanLineOutputPart *)local_2c0,(MultiPartOutputFile *)&local_2f8,(int)uVar18);
      pdVar15 = (data<float> *)auVar11;
      if (number_of_parts == 1) {
        pdVar15 = &local_278;
      }
      data<float>::writeData(pdVar15,(DeepScanLineOutputPart *)local_2c0);
      uVar18 = uVar18 + 1;
      auVar11 = (undefined1  [8])((long)auVar11 + 0xa0);
    } while (local_2d0 != uVar18);
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&local_2f8);
  std::
  vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>::
  ~vector((vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
           *)local_1a8);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
            ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)local_318);
  local_2f8._M_dataplus._M_p = (pointer)0x0;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_allocated_capacity = 0;
  Imf_3_2::CompositeDeepScanLine::CompositeDeepScanLine((CompositeDeepScanLine *)local_2c0);
  plVar9 = local_298[0];
  pdStack_1a0 = (pointer)((ulong)pdStack_1a0 & 0xffffffff00000000);
  local_198._M_allocated_capacity = 0;
  local_180 = 0;
  local_198._8_8_ = (_Base_ptr)&pdStack_1a0;
  local_188 = (_Base_ptr)&pdStack_1a0;
  iVar14 = Imf_3_2::globalThreadCount();
  uVar18 = local_2d0;
  Imf_3_2::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_1d0,(char *)plVar9,iVar14,true);
  std::vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>::
  vector((vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
          *)local_318,uVar18,&local_2c1);
  if (0 < number_of_parts) {
    sVar16 = 0;
    do {
      this = (DeepScanLineInputPart *)operator_new(8);
      Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                (this,(MultiPartInputFile *)&local_1d0,(int)sVar16);
      *(DeepScanLineInputPart **)((long)local_318 + sVar16 * 8) = this;
      Imf_3_2::CompositeDeepScanLine::addSource((DeepScanLineInputPart *)local_2c0);
      sVar16 = sVar16 + 1;
    } while (local_2d0 != sVar16);
  }
  pBVar12 = (Box2i *)Imf_3_2::CompositeDeepScanLine::dataWindow();
  dontbothercheckingdepth = local_29c._0_1_;
  data<float>::setUpFrameBuffer
            (&local_278,(vector<float,_std::allocator<float>_> *)&local_2f8,(FrameBuffer *)local_1a8
             ,pBVar12,local_29c._0_1_);
  Imf_3_2::CompositeDeepScanLine::setFrameBuffer((FrameBuffer *)local_2c0);
  if ((char)local_2a0 == '\0') {
    lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar14 = *(int *)(lVar6 + 4);
    while (lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow(), iVar14 < *(int *)(lVar6 + 0xc)) {
      iVar4 = random_int(0x40);
      lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow();
      iVar4 = iVar4 + iVar14;
      if (*(int *)(lVar6 + 0xc) < iVar4) {
        lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow();
        iVar4 = *(int *)(lVar6 + 0xc);
      }
      Imf_3_2::CompositeDeepScanLine::readPixels((int)local_2c0,iVar14);
      iVar14 = iVar4;
    }
  }
  else {
    lVar6 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar14 = *(int *)(lVar6 + 4);
    Imf_3_2::CompositeDeepScanLine::dataWindow();
    Imf_3_2::CompositeDeepScanLine::readPixels((int)local_2c0,iVar14);
  }
  pBVar12 = (Box2i *)Imf_3_2::CompositeDeepScanLine::dataWindow();
  data<float>::checkValues
            (&local_278,(vector<float,_std::allocator<float>_> *)&local_2f8,pBVar12,
             dontbothercheckingdepth);
  if (0 < number_of_parts) {
    sVar16 = 0;
    do {
      if (*(void **)((long)local_318 + sVar16 * 8) != (void *)0x0) {
        operator_delete(*(void **)((long)local_318 + sVar16 * 8),8);
      }
      sVar16 = sVar16 + 1;
    } while (local_2d0 != sVar16);
  }
  if (local_318 != (undefined1  [8])0x0) {
    operator_delete((void *)local_318,
                    CONCAT62(local_308._M_allocated_capacity._2_6_,
                             local_308._M_allocated_capacity._0_2_) - (long)local_318);
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&local_1d0);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)local_1a8);
  Imf_3_2::CompositeDeepScanLine::~CompositeDeepScanLine((CompositeDeepScanLine *)local_2c0);
  if (local_2f8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_2f8._M_dataplus._M_p,
                    local_2f8.field_2._M_allocated_capacity - (long)local_2f8._M_dataplus._M_p);
  }
  plVar9 = local_298[0];
  if (number_of_parts == 1) {
    iVar14 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)local_318,(char *)plVar9,iVar14);
    local_2f8._M_dataplus._M_p = (pointer)0x0;
    local_2f8._M_string_length = 0;
    local_2f8.field_2._M_allocated_capacity = 0;
    pdStack_1a0 = (pointer)((ulong)pdStack_1a0 & 0xffffffff00000000);
    local_198._M_allocated_capacity = 0;
    local_180 = 0;
    local_198._8_8_ = (_Base_ptr)&pdStack_1a0;
    local_188 = (_Base_ptr)&pdStack_1a0;
    Imf_3_2::InputFile::header();
    pBVar12 = (Box2i *)Imf_3_2::Header::dataWindow();
    data<float>::setUpFrameBuffer
              (&local_278,(vector<float,_std::allocator<float>_> *)&local_2f8,
               (FrameBuffer *)local_1a8,pBVar12,dontbothercheckingdepth);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)local_318);
    iVar14 = (pBVar12->min).y;
    if ((char)local_2a0 == '\0') {
      while (iVar14 < (pBVar12->max).y) {
        iVar5 = random_int(0x40);
        iVar4 = (pBVar12->max).y;
        iVar2 = iVar5 + iVar14;
        if (iVar4 <= iVar5 + iVar14) {
          iVar2 = iVar4;
        }
        Imf_3_2::InputFile::readPixels((int)local_318,iVar14);
        iVar14 = iVar2;
      }
    }
    else {
      Imf_3_2::InputFile::readPixels((int)local_318,iVar14);
    }
    data<float>::checkValues
              (&local_278,(vector<float,_std::allocator<float>_> *)&local_2f8,pBVar12,
               dontbothercheckingdepth);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)local_1a8);
    if (local_2f8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      local_2f8.field_2._M_allocated_capacity - (long)local_2f8._M_dataplus._M_p);
    }
    Imf_3_2::InputFile::~InputFile((InputFile *)local_318);
  }
  remove((char *)local_298[0]);
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::~vector(&local_278._samples);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_278._current_pixel);
  if (local_278._current_sample.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278._current_sample.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278._current_sample.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278._current_sample.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_278._results);
  if (local_278._current_result.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278._current_result.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278._current_result.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278._current_result.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278._channels);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  return;
}

Assistant:

void
test_parts (
    int                pattern_number,
    int                number_of_parts,
    bool               load_depths,
    bool               entire_buffer,
    const std::string& tempDir)
{
    std::string fn = tempDir + "imf_test_composite_deep_scanline_source.exr";

    data<T> main;
    make_pattern (main, pattern_number);
    write_file (fn.c_str (), main, number_of_parts);

    {
        vector<T>                      data;
        CompositeDeepScanLine          comp;
        FrameBuffer                    testbuf;
        MultiPartInputFile             input (fn.c_str ());
        vector<DeepScanLineInputPart*> parts (number_of_parts);

        // use 'part' interface TODO test file interface too
        for (int i = 0; i < number_of_parts; i++)
        {
            parts[i] = new DeepScanLineInputPart (input, i);
            comp.addSource (parts[i]);
        }

        main.setUpFrameBuffer (
            data, testbuf, comp.dataWindow (), load_depths);

        comp.setFrameBuffer (testbuf);

        //
        // try loading the whole buffer
        //
        if (entire_buffer)
        {
            comp.readPixels (
                comp.dataWindow ().min.y, comp.dataWindow ().max.y);
        }
        else
        {
            int low = comp.dataWindow ().min.y;
            while (low < comp.dataWindow ().max.y)
            {
                int high = low + random_int (64);
                if (high > comp.dataWindow ().max.y)
                    high = comp.dataWindow ().max.y;
                comp.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, comp.dataWindow (), load_depths);

        for (int i = 0; i < number_of_parts; i++)
        {
            delete parts[i];
        }
    }
    if (number_of_parts == 1)
    {
        // also test InputFile interface
        InputFile    file (fn.c_str ());
        vector<T>    data;
        FrameBuffer  testbuf;
        const Box2i& dataWindow = file.header ().dataWindow ();
        main.setUpFrameBuffer (data, testbuf, dataWindow, load_depths);
        file.setFrameBuffer (testbuf);
        if (entire_buffer)
        {
            file.readPixels (dataWindow.min.y, dataWindow.max.y);
        }
        else
        {
            int low = dataWindow.min.y;
            while (low < dataWindow.max.y)
            {
                int high = low + random_int (64);
                if (high > dataWindow.max.y) high = dataWindow.max.y;
                file.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, dataWindow, load_depths);
    }
    remove (fn.c_str ());
}